

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

void Curl_conncontrol(connectdata *conn,int ctrl)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = ctrl;
  if (ctrl != 1) {
    if (ctrl == 2) {
      uVar2 = (uint)((conn->handler->flags & 0x200) == 0);
    }
    else {
      uVar2 = 0;
    }
  }
  if (((ctrl != 2) || ((conn->handler->flags & 0x200) == 0)) &&
     (uVar1 = *(uint *)&(conn->bits).field_0x4, uVar2 != ((uVar1 >> 6 & 1) != 0))) {
    *(uint *)&(conn->bits).field_0x4 = uVar1 & 0xffffffbf | (uVar2 & 1) << 6;
  }
  return;
}

Assistant:

const char *reason
#endif
  )
{
  /* close if a connection, or a stream that isn't multiplexed. */
  /* This function will be called both before and after this connection is
     associated with a transfer. */
  bool closeit;
  DEBUGASSERT(conn);
#if defined(DEBUGBUILD) && !defined(CURL_DISABLE_VERBOSE_STRINGS)
  (void)reason; /* useful for debugging */
#endif
  closeit = (ctrl == CONNCTRL_CONNECTION) ||
    ((ctrl == CONNCTRL_STREAM) && !(conn->handler->flags & PROTOPT_STREAM));
  if((ctrl == CONNCTRL_STREAM) &&
     (conn->handler->flags & PROTOPT_STREAM))
    ;
  else if((bit)closeit != conn->bits.close) {
    conn->bits.close = closeit; /* the only place in the source code that
                                   should assign this bit */
  }
}